

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUnexpectedCommand.cxx
# Opt level: O2

bool __thiscall
cmUnexpectedCommand::InitialPass
          (cmUnexpectedCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *param_1,cmExecutionStatus *param_2)

{
  cmMakefile *this_00;
  bool bVar1;
  char *__nptr;
  double dVar2;
  allocator local_39;
  string local_38;
  
  this_00 = (this->super_cmCommand).Makefile;
  std::__cxx11::string::string((string *)&local_38,"CMAKE_MINIMUM_REQUIRED_VERSION",&local_39);
  __nptr = cmMakefile::GetDefinition(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  bVar1 = std::operator==(&this->Name,"endif");
  if (bVar1) {
    if (__nptr == (char *)0x0) {
      return true;
    }
    dVar2 = atof(__nptr);
    if (dVar2 <= 1.4) {
      return true;
    }
  }
  std::__cxx11::string::string((string *)&local_38,this->Error,&local_39);
  cmCommand::SetError(&this->super_cmCommand,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return false;
}

Assistant:

bool cmUnexpectedCommand::InitialPass(std::vector<std::string> const&,
                                      cmExecutionStatus&)
{
  const char* versionValue =
    this->Makefile->GetDefinition("CMAKE_MINIMUM_REQUIRED_VERSION");
  if (this->Name == "endif" && (!versionValue || atof(versionValue) <= 1.4)) {
    return true;
  }

  this->SetError(this->Error);
  return false;
}